

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,DoWhileLoopStatement *stmt)

{
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState> *this_00;
  long in_RDI;
  type oldBreakStates;
  SmallVector<slang::analysis::DataFlowState,_2UL> *in_stack_fffffffffffffda8;
  pointer in_stack_fffffffffffffdc0;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_fffffffffffffdc8;
  SmallVector<slang::analysis::DataFlowState,_2UL> *in_stack_fffffffffffffe90;
  DataFlowState *in_stack_fffffffffffffe98;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_fffffffffffffea0;
  
  this_00 = (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
             *)(in_RDI + 0x558);
  SmallVector<slang::analysis::DataFlowState,_2UL>::SmallVector
            ((SmallVector<slang::analysis::DataFlowState,_2UL> *)this_00,in_stack_fffffffffffffda8);
  SmallVectorBase<slang::analysis::DataFlowState>::clear
            ((SmallVectorBase<slang::analysis::DataFlowState> *)this_00);
  visit<slang::ast::Statement>(this_00,(Statement *)in_stack_fffffffffffffda8);
  visitCondition(in_stack_fffffffffffffdc8,(Expression *)in_stack_fffffffffffffdc0);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x6100bc);
  DataFlowState::DataFlowState((DataFlowState *)this_00,(DataFlowState *)&stack0xfffffffffffffdc0);
  loopTail(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  DataFlowState::~DataFlowState((DataFlowState *)0x6100f8);
  SmallVector<slang::analysis::DataFlowState,_2UL>::~SmallVector
            ((SmallVector<slang::analysis::DataFlowState,_2UL> *)0x610105);
  return;
}

Assistant:

void visitStmt(const DoWhileLoopStatement& stmt) {
        auto oldBreakStates = std::move(breakStates);
        breakStates.clear();
        visit(stmt.body);

        visitCondition(stmt.cond);

        loopTail(std::move(stateWhenFalse), std::move(oldBreakStates));
    }